

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_pollq_epoll.c
# Opt level: O0

int nni_epoll_pq_create(nni_posix_pollq *pq)

{
  int iVar1;
  int *piVar2;
  int rv;
  nni_posix_pollq *pq_local;
  
  nni_list_init_offset(&pq->reapq,0);
  nni_mtx_init(&pq->mtx);
  nni_cv_init(&pq->cv,&pq->mtx);
  pq->epfd = -1;
  pq->init = true;
  iVar1 = epoll_create1(0x80000);
  pq->epfd = iVar1;
  if (iVar1 < 0) {
    piVar2 = __errno_location();
    pq_local._4_4_ = nni_plat_errno(*piVar2);
  }
  else {
    pq->close = false;
    pq_local._4_4_ = nni_epoll_pq_add_eventfd(pq);
    if (pq_local._4_4_ == 0) {
      pq_local._4_4_ = nni_thr_init(&pq->thr,nni_epoll_thr,pq);
      if (pq_local._4_4_ == 0) {
        nni_thr_set_name(&pq->thr,"nng:poll:epoll");
        nni_thr_run(&pq->thr);
        pq_local._4_4_ = 0;
      }
      else {
        close(pq->epfd);
        close(pq->evfd);
        nni_mtx_fini(&pq->mtx);
      }
    }
    else {
      close(pq->epfd);
      nni_mtx_fini(&pq->mtx);
    }
  }
  return pq_local._4_4_;
}

Assistant:

static int
nni_epoll_pq_create(nni_posix_pollq *pq)
{
	int rv;

	NNI_LIST_INIT(&pq->reapq, nni_posix_pfd, node);
	nni_mtx_init(&pq->mtx);
	nni_cv_init(&pq->cv, &pq->mtx);
	pq->epfd = -1;
	pq->init = true;

#if NNG_HAVE_EPOLL_CREATE1
	if ((pq->epfd = epoll_create1(EPOLL_CLOEXEC)) < 0) {
		return (nni_plat_errno(errno));
	}
#else
	// Old Linux.  Size is a "hint" about number of descriptors.
	// Hopefully not a hard limit, and not used in modern Linux.
	if ((pq->epfd = epoll_create(16)) < 0) {
		return (nni_plat_errno(errno));
	}
	(void) fcntl(pq->epfd, F_SETFD, FD_CLOEXEC);
#endif

	pq->close = false;

	if ((rv = nni_epoll_pq_add_eventfd(pq)) != 0) {
		(void) close(pq->epfd);
		nni_mtx_fini(&pq->mtx);
		return (rv);
	}
	if ((rv = nni_thr_init(&pq->thr, nni_epoll_thr, pq)) != 0) {
		(void) close(pq->epfd);
		(void) close(pq->evfd);
		nni_mtx_fini(&pq->mtx);
		return (rv);
	}
	nni_thr_set_name(&pq->thr, "nng:poll:epoll");
	nni_thr_run(&pq->thr);
	return (0);
}